

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O0

int prolog2(PROLOG_STATE *state,int tok,char *UNUSED_ptr,char *UNUSED_end,ENCODING *UNUSED_enc)

{
  ENCODING *UNUSED_enc_local;
  char *UNUSED_end_local;
  char *UNUSED_ptr_local;
  int tok_local;
  PROLOG_STATE *state_local;
  
  switch(tok) {
  case 0xb:
    state_local._4_4_ = 0x37;
    break;
  default:
    state_local._4_4_ = common(state,tok);
    break;
  case 0xd:
    state_local._4_4_ = 0x38;
    break;
  case 0xf:
    state_local._4_4_ = 0;
    break;
  case 0x1d:
    state->handler = error;
    state_local._4_4_ = 2;
  }
  return state_local._4_4_;
}

Assistant:

static int PTRCALL
prolog2(PROLOG_STATE *state,
        int tok,
        const char *UNUSED_P(ptr),
        const char *UNUSED_P(end),
        const ENCODING *UNUSED_P(enc))
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_PI:
    return XML_ROLE_PI;
  case XML_TOK_COMMENT:
    return XML_ROLE_COMMENT;
  case XML_TOK_INSTANCE_START:
    state->handler = error;
    return XML_ROLE_INSTANCE_START;
  }
  return common(state, tok);
}